

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  _IO_FILE *in_stack_fffffffffffffb28;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  allocator_type *in_stack_fffffffffffffb40;
  key_equal *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  size_type in_stack_fffffffffffffb58;
  Type TVar5;
  string *s;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  char *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  AssertHelper *in_stack_fffffffffffffbb0;
  AssertionResult local_3d8 [2];
  AssertionResult local_3b8;
  string local_3a8 [55];
  undefined1 local_371;
  AssertionResult local_370;
  StringIO local_360;
  string local_358;
  allocator local_321;
  string local_320 [32];
  AssertionResult local_300 [2];
  allocator local_2d9;
  string local_2d8 [32];
  AssertionResult local_2b8 [2];
  int local_298;
  undefined4 local_294;
  AssertionResult local_290 [2];
  size_t local_270;
  AssertionResult local_268;
  char local_258 [40];
  undefined8 local_230;
  AssertionResult local_228;
  size_t local_218;
  string local_210 [55];
  undefined1 local_1d9;
  AssertionResult local_1d8;
  string local_1c8 [55];
  undefined1 local_191;
  AssertionResult local_190;
  string local_180 [55];
  undefined1 local_149;
  AssertionResult local_148;
  FILE *local_138;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [48];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  
  Hasher::Hasher(&local_b4,0);
  Hasher::Hasher(&local_c0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (hasher *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  TVar5 = (Type)(in_stack_fffffffffffffb58 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,anon_var_dwarf_14da82,0x18,&local_101);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"$hu1",0x14,&local_129);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  bVar2 = google::
          HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite(&local_a8);
  if (bVar2) {
    local_138 = tmpfile();
    local_149 = local_138 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfa5806);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_148);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_180);
      testing::Message::~Message((Message *)0xfa5957);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa59eb);
    local_191 = google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_metadata<_IO_FILE>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfa5a32);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_1c8);
      testing::Message::~Message((Message *)0xfa5b07);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa5b9b);
    local_1d9 = google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_nopointer_data<_IO_FILE>
                          (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfa5be2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_210);
      testing::Message::~Message((Message *)0xfa5cb7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa5d4e);
    local_218 = ftell(local_138);
    rewind(local_138);
    local_230 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (unsigned_long *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0xfa5e03);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xfa5e66);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa5ed7);
    local_270 = fread(local_258,1,local_218,local_138);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (unsigned_long *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffbb0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfa5f86);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xfa5fe9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa605a);
    local_294 = 0xffffffff;
    in_stack_fffffffffffffbac = fgetc(local_138);
    local_298 = in_stack_fffffffffffffbac;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_290);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffba0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfa60fc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xfa6159);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa61ca);
    fclose(local_138);
    in_stack_fffffffffffffb94 = (int)local_258[0];
    in_stack_fffffffffffffb98 = (char *)std::__cxx11::string::operator[]((ulong)local_100);
    sVar1 = local_218;
    if (in_stack_fffffffffffffb94 == *in_stack_fffffffffffffb98) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,local_258,sVar1,&local_2d9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        testing::AssertionResult::failure_message((AssertionResult *)0xfa6327);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
        testing::Message::~Message((Message *)0xfa6384);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa63ef);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,local_258,sVar1,&local_321);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_300);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        in_stack_fffffffffffffb60 =
             (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xfa650a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
        testing::Message::~Message((Message *)0xfa6567);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa65d2);
    }
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  bVar2 = google::
          HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization(&local_a8);
  if (bVar2) {
    s = &local_358;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_360,s);
    TVar5 = (Type)((ulong)s >> 0x20);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_a8.
                        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       ,&local_360);
    local_371 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfa6665);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(uVar3,in_stack_fffffffffffffb50),iVar4,
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_3a8);
      testing::Message::~Message((Message *)0xfa6741);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa67d8);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_358);
    iVar4 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_100);
    if (iVar4 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfa689b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb50),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfa68f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa6963);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        testing::AssertionResult::failure_message((AssertionResult *)0xfa69db);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb60,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb50),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
        testing::Message::~Message((Message *)0xfa6a36);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa6aa1);
    }
    std::__cxx11::string::~string((string *)&local_358);
  }
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xfa6af7);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}